

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
 Lib::
 VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
 ::getEmpty(void)

{
  int iVar1;
  IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
  *core;
  IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
  *in_RDI;
  
  if (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::Demodulation::Rhs>>
      ::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::Demodulation::Rhs>>
                                 ::getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
              *)EmptyIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::Demodulation::Rhs>>
                ::operator_new(0x3c855a);
      EmptyIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
      ::EmptyIterator((EmptyIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
                       *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::Demodulation::Rhs>>
                           ::getEmpty()::inst);
    }
  }
  VirtualIterator((VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
                   *)in_RDI,&getEmpty::inst);
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Rhs>_>
          )in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }